

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetBooks.cpp
# Opt level: O2

void __thiscall GetBooks::operator()(GetBooks *this)

{
  HttpRequest *this_00;
  bool bVar1;
  unsigned_short uVar2;
  string *psVar3;
  reference this_01;
  ostream *poVar4;
  reference pvVar5;
  Session *session;
  char *pcVar6;
  json Json;
  string reply;
  iterator __begin2;
  iterator __end2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  string local_a0;
  iterator local_80;
  iterator local_58;
  
  bVar1 = Session::IsConnected((this->super_Event).m_Owner);
  if (bVar1) {
    psVar3 = Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
    if (psVar3->_M_string_length != 0) {
      this_00 = &(this->super_Event).m_Request;
      HttpRequest::SetRequest(this_00,"GET","/api/v1/tema/library/books","HTTP/1.1","");
      HttpRequest::SetHost(this_00,"ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
      HttpRequest::ClearHeaders(this_00);
      HttpRequest::AddHeader(this_00,"Connection","keep-alive");
      psVar3 = Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                     "Bearer ",psVar3);
      HttpRequest::AddHeader(this_00,"Authorization",(char *)local_80.m_object);
      std::__cxx11::string::~string((string *)&local_80);
      HttpRequest::ClearCookies(this_00);
      psVar3 = Session::GetConnectSid_abi_cxx11_((this->super_Event).m_Owner);
      HttpRequest::AddCookie(this_00,"connect.sid",(psVar3->_M_dataplus)._M_p);
      HttpRequest::SetData(this_00,"");
      Session::OpenConnection((this->super_Event).m_Owner);
      HttpRequest::Send(this_00,(this->super_Event).m_Owner);
      Connection::ReceiveHttps_abi_cxx11_
                (&local_a0,(Connection *)(this->super_Event).m_Owner,session);
      Session::CloseConnection((this->super_Event).m_Owner);
      uVar2 = HttpReply::ExtractSign(&local_a0);
      if (uVar2 == 200) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&local_b0,(nullptr_t)0x0);
        HttpReply::ExtractData(&local_a0,&local_b0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::begin(&local_80,&local_b0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::end(&local_58,&local_b0);
        while( true ) {
          bVar1 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator!=(&local_80,&local_58);
          if (!bVar1) break;
          this_01 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*(&local_80);
          poVar4 = std::operator<<((ostream *)&std::cout,"Id: ");
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"id");
          poVar4 = nlohmann::operator<<(poVar4,pvVar5);
          std::endl<char,std::char_traits<char>>(poVar4);
          poVar4 = std::operator<<((ostream *)&std::cout,"Title: ");
          pvVar5 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)this_01,"title");
          poVar4 = nlohmann::operator<<(poVar4,pvVar5);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator++(&local_80);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_b0);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"Get books failed ");
        poVar4 = std::operator<<(poVar4,"error ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,uVar2);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      std::__cxx11::string::~string((string *)&local_a0);
      return;
    }
    pcVar6 = "To proceed this command you need library access";
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"You are not connected");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar6 = "Please login to proceed this command";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void GetBooks::operator()() {
    using namespace std;
    if (!m_Owner->IsConnected()) {
        cout << "You are not connected" << endl;
        cout << "Please login to proceed this command" << endl;
        return;
    }
    else if (m_Owner->GetToken().empty()) {
        cout << "To proceed this command you need library access" << endl;
        return;
    }
    m_Request.SetRequest("GET", "/api/v1/tema/library/books", "HTTP/1.1");
    m_Request.SetHost("ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    m_Request.ClearHeaders();
    m_Request.AddHeader("Connection", "keep-alive");
    m_Request.AddHeader("Authorization", ("Bearer " + m_Owner->GetToken()).c_str());
    m_Request.ClearCookies();
    m_Request.AddCookie("connect.sid", m_Owner->GetConnectSid().c_str());
    m_Request.SetData("");
    m_Owner->OpenConnection();
    m_Request.Send(*m_Owner);
    std::string reply = Connection::ReceiveHttps(*m_Owner);
    m_Owner->CloseConnection();
    unsigned short sign = HttpReply::ExtractSign(reply);
    if (sign == 200) {
        json Json;
        HttpReply::ExtractData(reply, Json);
        for (auto & iter : Json) {
            cout << "Id: " << iter["id"] << endl;
            cout << "Title: " << iter["title"] << endl;
            cout << endl;
        }
    }
    else {
        cout << "Get books failed " << "error " << sign << std::endl;
    }
}